

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::showButtonsInMenuBar(QMdiSubWindowPrivate *this,QMenuBar *menuBar)

{
  bool bVar1;
  int iVar2;
  QMdiSubWindowPrivate *this_00;
  QPointer<QMdi::ControlContainer> *this_01;
  QWidget *this_02;
  QWidget *pQVar3;
  QLayout *pQVar4;
  ControlContainer *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  int buttonHeight;
  QWidget *topLevelWindow;
  QMdiSubWindow *q;
  QEvent event;
  ControlContainer *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 mod;
  int iVar5;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QMdiSubWindowPrivate *)q_func(in_RDI);
  bVar1 = isChildOfTabbedQMdiArea((QMdiSubWindow *)in_stack_ffffffffffffffa8);
  if (!bVar1) {
    removeButtonsFromMenuBar(this_00);
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMdi::ControlContainer> *)0x6316a4);
    if (!bVar1) {
      this_01 = (QPointer<QMdi::ControlContainer> *)operator_new(0x70);
      QMdi::ControlContainer::ControlContainer
                ((ControlContainer *)q,(QMdiSubWindow *)topLevelWindow);
      QPointer<QMdi::ControlContainer>::operator=(this_01,in_stack_ffffffffffffffa8);
    }
    in_RDI->ignoreWindowTitleChange = true;
    QPointer<QMdi::ControlContainer>::operator->((QPointer<QMdi::ControlContainer> *)0x6316f2);
    QMdi::ControlContainer::showButtonsInMenuBar(in_RSI,(QMenuBar *)this_00);
    in_RDI->ignoreWindowTitleChange = false;
    this_02 = QWidget::window((QWidget *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    mod = (undefined1)((uint)in_stack_ffffffffffffffc4 >> 0x18);
    QWidget::isWindowModified((QWidget *)0x63172d);
    QWidget::setWindowModified(this_02,(bool)mod);
    QObject::installEventFilter(&this_02->super_QObject);
    iVar5 = 0;
    QPointer<QMdi::ControlContainer>::operator->((QPointer<QMdi::ControlContainer> *)0x631764);
    pQVar3 = QMdi::ControlContainer::controllerWidget((ControlContainer *)0x63176c);
    if (pQVar3 == (QWidget *)0x0) {
      QPointer<QMdi::ControlContainer>::operator->((QPointer<QMdi::ControlContainer> *)0x6317aa);
      pQVar3 = QMdi::ControlContainer::systemMenuLabel((ControlContainer *)0x6317b2);
      if (pQVar3 != (QWidget *)0x0) {
        QPointer<QMdi::ControlContainer>::operator->((QPointer<QMdi::ControlContainer> *)0x6317c9);
        QMdi::ControlContainer::systemMenuLabel((ControlContainer *)0x6317d1);
        iVar5 = QWidget::height((QWidget *)0x6317d9);
      }
    }
    else {
      QPointer<QMdi::ControlContainer>::operator->((QPointer<QMdi::ControlContainer> *)0x631783);
      QMdi::ControlContainer::controllerWidget((ControlContainer *)0x63178b);
      iVar5 = QWidget::height((QWidget *)0x631793);
    }
    if (((in_RSI != (ControlContainer *)0x0) &&
        (iVar2 = QWidget::height((QWidget *)0x6317f1), iVar2 < iVar5)) &&
       (pQVar4 = QWidget::layout((QWidget *)0x631801), pQVar4 != (QLayout *)0x0)) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QEvent::QEvent((QEvent *)&local_18,LayoutRequest);
      QCoreApplication::sendEvent(&this_02->super_QObject,(QEvent *)&local_18);
      QEvent::~QEvent((QEvent *)&local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::showButtonsInMenuBar(QMenuBar *menuBar)
{
    Q_Q(QMdiSubWindow);
    Q_ASSERT(q->isMaximized() && !drawTitleBarWhenMaximized());

    if (isChildOfTabbedQMdiArea(q))
        return;

    removeButtonsFromMenuBar();
    if (!controlContainer)
        controlContainer = new ControlContainer(q);

    ignoreWindowTitleChange = true;
    controlContainer->showButtonsInMenuBar(menuBar);
    ignoreWindowTitleChange = false;

    QWidget *topLevelWindow = q->window();
    topLevelWindow->setWindowModified(q->isWindowModified());
    topLevelWindow->installEventFilter(q);

    int buttonHeight = 0;
    if (controlContainer->controllerWidget())
        buttonHeight = controlContainer->controllerWidget()->height();
    else if (controlContainer->systemMenuLabel())
        buttonHeight = controlContainer->systemMenuLabel()->height();

    // This will rarely happen.
    if (menuBar && menuBar->height() < buttonHeight
            && topLevelWindow->layout()) {
        // Make sure topLevelWindow->contentsRect returns correct geometry.
        // topLevelWidget->updateGeoemtry will not do the trick here since it will post the event.
        QEvent event(QEvent::LayoutRequest);
        QCoreApplication::sendEvent(topLevelWindow, &event);
    }
}